

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParseElementContentDecl(xmlParserCtxtPtr ctxt,xmlChar *name,xmlElementContentPtr *result)

{
  xmlParserInputPtr pxVar1;
  xmlChar *pxVar2;
  xmlElementContentPtr pxVar3;
  int iVar4;
  
  iVar4 = ctxt->input->id;
  *result = (xmlElementContentPtr)0x0;
  if (*ctxt->input->cur == '(') {
    xmlNextChar(ctxt);
    pxVar1 = ctxt->input;
    if (((pxVar1->flags & 0x40) == 0) && ((long)pxVar1->end - (long)pxVar1->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    xmlSkipBlankCharsPE(ctxt);
    pxVar2 = ctxt->input->cur;
    if ((((*pxVar2 == '#') && (pxVar2[1] == 'P')) && (pxVar2[2] == 'C')) &&
       (((pxVar2[3] == 'D' && (pxVar2[4] == 'A')) && ((pxVar2[5] == 'T' && (pxVar2[6] == 'A')))))) {
      pxVar3 = xmlParseElementMixedContentDecl(ctxt,iVar4);
      iVar4 = 3;
    }
    else {
      pxVar3 = xmlParseElementChildrenContentDeclPriv(ctxt,iVar4,1);
      iVar4 = 4;
    }
    xmlSkipBlankCharsPE(ctxt);
    *result = pxVar3;
  }
  else {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ELEMCONTENT_NOT_STARTED,XML_ERR_FATAL,
               name,(xmlChar *)0x0,(xmlChar *)0x0,0,
               "xmlParseElementContentDecl : %s \'(\' expected\n",name);
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int
xmlParseElementContentDecl(xmlParserCtxtPtr ctxt, const xmlChar *name,
                           xmlElementContentPtr *result) {

    xmlElementContentPtr tree = NULL;
    int inputid = ctxt->input->id;
    int res;

    *result = NULL;

    if (RAW != '(') {
	xmlFatalErrMsgStr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED,
		"xmlParseElementContentDecl : %s '(' expected\n", name);
	return(-1);
    }
    NEXT;
    GROW;
    SKIP_BLANKS_PE;
    if (CMP7(CUR_PTR, '#', 'P', 'C', 'D', 'A', 'T', 'A')) {
        tree = xmlParseElementMixedContentDecl(ctxt, inputid);
	res = XML_ELEMENT_TYPE_MIXED;
    } else {
        tree = xmlParseElementChildrenContentDeclPriv(ctxt, inputid, 1);
	res = XML_ELEMENT_TYPE_ELEMENT;
    }
    SKIP_BLANKS_PE;
    *result = tree;
    return(res);
}